

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void checkSolutionReal<double>(SoPlexBase<double> *soplex)

{
  bool bVar1;
  Verbosity VVar2;
  SPxOut *_spxout;
  SoPlexBase<double> *in_RDI;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  bool feasible_1;
  double maxviol_1;
  Verbosity old_verbosity_3;
  double sumviol_1;
  double dualviol;
  double redcostviol;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool feasible;
  double maxviol;
  Verbosity old_verbosity;
  double sumviol;
  double rowviol;
  double boundviol;
  SPxOut *in_stack_ffffffffffffff48;
  SPxOut *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  SoPlexBase<double> *in_stack_ffffffffffffff68;
  double *local_90;
  Verbosity in_stack_ffffffffffffff78;
  Verbosity in_stack_ffffffffffffff7c;
  Verbosity in_stack_ffffffffffffff80;
  Verbosity in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Verbosity local_68;
  Verbosity local_64 [3];
  SPxOut *local_58;
  SPxOut *local_50;
  Verbosity in_stack_ffffffffffffffb8;
  Verbosity in_stack_ffffffffffffffbc;
  Verbosity in_stack_ffffffffffffffc0;
  Verbosity in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Verbosity local_28;
  Verbosity local_24 [3];
  double *local_18;
  double *local_10;
  SoPlexBase<double> *local_8;
  
  local_8 = in_RDI;
  bVar1 = ::soplex::SoPlexBase<double>::hasPrimal((SoPlexBase<double> *)0x14bc7c);
  if (bVar1) {
    bVar1 = ::soplex::SoPlexBase<double>::getBoundViolation
                      ((SoPlexBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (double *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (double *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if ((bVar1) &&
       (bVar1 = ::soplex::SoPlexBase<double>::getRowViolation
                          ((SoPlexBase<double> *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (double *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
       bVar1)) {
      if ((local_8 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar2 = ::soplex::SPxOut::getVerbosity(&local_8->spxout), 2 < (int)VVar2)) {
        local_24[0] = ::soplex::SPxOut::getVerbosity(&local_8->spxout);
        local_28 = INFO1;
        ::soplex::SPxOut::setVerbosity(&local_8->spxout,&local_28);
        if ((double)local_10 <= (double)local_18) {
          local_90 = local_18;
        }
        else {
          local_90 = local_10;
        }
        ::soplex::SoPlexBase<double>::realParam(local_8,FEASTOL);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        ::soplex::operator<<
                  (in_stack_ffffffffffffff50,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff68 =
             (SoPlexBase<double> *)
             ::soplex::operator<<(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
        std::setprecision(8);
        ::soplex::operator<<
                  (in_stack_ffffffffffffff48,
                   (_Setprecision)(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        ::soplex::operator<<
                  (in_stack_ffffffffffffff50,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_ffffffffffffff48);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        ::soplex::SPxOut::setVerbosity(&local_8->spxout,local_24);
        in_stack_ffffffffffffff60 = local_90;
      }
    }
    else if ((local_8 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
            (VVar2 = ::soplex::SPxOut::getVerbosity(&local_8->spxout), 2 < (int)VVar2)) {
      ::soplex::SPxOut::getVerbosity(&local_8->spxout);
      ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffffc0);
      ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffffc4);
    }
  }
  else if ((local_8 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
          (VVar2 = ::soplex::SPxOut::getVerbosity(&local_8->spxout), 2 < (int)VVar2)) {
    ::soplex::SPxOut::getVerbosity(&local_8->spxout);
    ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffffb8);
    ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffffbc);
  }
  bVar1 = ::soplex::SoPlexBase<double>::hasDual((SoPlexBase<double> *)0x14bfc2);
  if (bVar1) {
    bVar1 = ::soplex::SoPlexBase<double>::getRedCostViolation
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                      );
    if ((bVar1) &&
       (bVar1 = ::soplex::SoPlexBase<double>::getDualViolation
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff58), bVar1)) {
      if ((local_8 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar2 = ::soplex::SPxOut::getVerbosity(&local_8->spxout), 2 < (int)VVar2)) {
        local_64[0] = ::soplex::SPxOut::getVerbosity(&local_8->spxout);
        local_68 = INFO1;
        ::soplex::SPxOut::setVerbosity(&local_8->spxout,&local_68);
        if ((double)local_58 < (double)local_50) {
          local_58 = local_50;
        }
        ::soplex::SoPlexBase<double>::realParam(local_8,OPTTOL);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)local_58);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)local_58);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)local_58);
        ::soplex::operator<<(in_stack_ffffffffffffff50,(_func_ios_base_ptr_ios_base_ptr *)local_58);
        _spxout = ::soplex::operator<<(in_stack_ffffffffffffff50,(double)local_58);
        std::setprecision(8);
        ::soplex::operator<<(local_58,(_Setprecision)(int)((ulong)_spxout >> 0x20));
        ::soplex::operator<<(_spxout,(_func_ios_base_ptr_ios_base_ptr *)local_58);
        ::soplex::operator<<(_spxout,(char *)local_58);
        ::soplex::SPxOut::setVerbosity(&local_8->spxout,local_64);
      }
    }
    else if ((local_8 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
            (VVar2 = ::soplex::SPxOut::getVerbosity(&local_8->spxout), 2 < (int)VVar2)) {
      ::soplex::SPxOut::getVerbosity(&local_8->spxout);
      ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffff80);
      ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffff84);
    }
  }
  else if ((local_8 != (SoPlexBase<double> *)0xfffffffffffffff8) &&
          (VVar2 = ::soplex::SPxOut::getVerbosity(&local_8->spxout), 2 < (int)VVar2)) {
    ::soplex::SPxOut::getVerbosity(&local_8->spxout);
    ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffff78);
    ::soplex::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    ::soplex::SPxOut::setVerbosity(&local_8->spxout,(Verbosity *)&stack0xffffffffffffff7c);
  }
  return;
}

Assistant:

static
void checkSolutionReal(SoPlexBase<R>& soplex)
{
   if(soplex.hasPrimal())
   {
      R boundviol;
      R rowviol;
      R sumviol;

      if(soplex.getBoundViolation(boundviol, sumviol) && soplex.getRowViolation(rowviol, sumviol))
      {
         SPX_MSG_INFO1(soplex.spxout,
                       R maxviol = boundviol > rowviol ? boundviol : rowviol;
                       bool feasible = (maxviol <= soplex.realParam(SoPlexBase<R>::FEASTOL));
                       soplex.spxout << "Primal solution " << (feasible ? "feasible" : "infeasible")
                       << " in original problem (max. violation = " << std::scientific << maxviol
                       << std::setprecision(8) << std::fixed << ").\n");
      }
      else
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "Could not check primal solution.\n");
      }
   }
   else
   {
      SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal solution available.\n");
   }

   if(soplex.hasDual())
   {
      R redcostviol;
      R dualviol;
      R sumviol;

      if(soplex.getRedCostViolation(redcostviol, sumviol) && soplex.getDualViolation(dualviol, sumviol))
      {
         SPX_MSG_INFO1(soplex.spxout,
                       R maxviol = redcostviol > dualviol ? redcostviol : dualviol;
                       bool feasible = (maxviol <= soplex.realParam(SoPlexBase<R>::OPTTOL));
                       soplex.spxout << "Dual solution " << (feasible ? "feasible" : "infeasible")
                       << " in original problem (max. violation = " << std::scientific << maxviol
                       << std::setprecision(8) << std::fixed << ").\n"
                      );
      }
      else
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "Could not check dual solution.\n");
      }
   }
   else
   {
      SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual solution available.\n");
   }
}